

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QDockAreaLayoutItem>::assign<QDockAreaLayoutItem_const*,q20::identity>
          (QArrayDataPointer<QDockAreaLayoutItem> *this,QDockAreaLayoutItem *first,
          QDockAreaLayoutItem *last)

{
  QDockAreaLayoutItem *this_00;
  long lVar1;
  QDockAreaLayoutItem *pQVar2;
  long lVar3;
  long lVar4;
  QDockAreaLayoutItem *__cur;
  Data *pDVar5;
  QDockAreaLayoutItem *this_01;
  QDockAreaLayoutItem *this_02;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QDockAreaLayoutItem> local_58;
  QArrayData *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (long)last - (long)first >> 3;
  lVar4 = lVar3 * -0x3333333333333333;
  pDVar5 = this->d;
  if (pDVar5 == (Data *)0x0) {
LAB_0043bf39:
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QDockAreaLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
    local_40 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = (QDockAreaLayoutItem *)QArrayData::allocate(&local_40,0x28,0x10,lVar4,KeepSize);
    local_58.d = this->d;
    this->d = (Data *)local_40;
    local_58.ptr = this->ptr;
    this->ptr = pQVar2;
    local_58.size = this->size;
    this->size = 0;
    ~QArrayDataPointer(&local_58);
    pDVar5 = this->d;
    if (pDVar5 != (Data *)0x0) goto LAB_0043bf9d;
    this_01 = this->ptr;
    pQVar2 = this_01;
  }
  else {
    lVar1 = (pDVar5->super_QArrayData).alloc;
    if (lVar4 - lVar1 != 0 && lVar1 <= lVar4 ||
        1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) {
      if (lVar1 == lVar4 || SBORROW8(lVar1,lVar4) != lVar1 + lVar3 * 0x3333333333333333 < 0) {
        lVar1 = lVar4;
      }
      if (((pDVar5->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
           super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) {
        lVar4 = lVar1;
      }
      goto LAB_0043bf39;
    }
LAB_0043bf9d:
    pQVar2 = this->ptr;
    this_01 = (QDockAreaLayoutItem *)
              ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7) & 0xfffffffffffffff0);
    if (pQVar2 != this_01) {
      if (this->size != 0) {
        lVar4 = this->size * 0x28;
        do {
          QDockAreaLayoutItem::~QDockAreaLayoutItem(pQVar2);
          pQVar2 = pQVar2 + 1;
          lVar4 = lVar4 + -0x28;
        } while (lVar4 != 0);
      }
      this->size = 0;
      this->ptr = this_01;
      pQVar2 = this_01;
    }
  }
  pQVar2 = pQVar2 + this->size;
  for (; this_02 = pQVar2, this_00 = this_01, first != last; first = first + 1) {
    this_02 = this_01;
    if (this_01 == pQVar2) goto LAB_0043c01f;
    QDockAreaLayoutItem::operator=(this_01,first);
    this_01 = this_01 + 1;
  }
  for (; this_00 != pQVar2; this_00 = this_00 + 1) {
    QDockAreaLayoutItem::~QDockAreaLayoutItem(this_00);
    this_02 = this_01;
  }
LAB_0043c057:
  this->size = ((long)this_02 - (long)this->ptr >> 3) * -0x3333333333333333;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
LAB_0043c01f:
  do {
    QDockAreaLayoutItem::QDockAreaLayoutItem(this_02,first);
    first = first + 1;
    this_02 = this_02 + 1;
  } while (first != last);
  goto LAB_0043c057;
}

Assistant:

void assign(InputIterator first, InputIterator last, Projection proj = {})
    {
        // This function only provides the basic exception guarantee.
        constexpr bool IsFwdIt = std::is_convertible_v<
                typename std::iterator_traits<InputIterator>::iterator_category,
                std::forward_iterator_tag>;
        constexpr bool IsIdentity = std::is_same_v<Projection, q20::identity>;

        if constexpr (IsFwdIt) {
            const qsizetype n = std::distance(first, last);
            if (needsDetach() || n > constAllocatedCapacity()) {
                QArrayDataPointer allocated(detachCapacity(n));
                swap(allocated);
            }
        } else if (needsDetach()) {
            QArrayDataPointer allocated(allocatedCapacity());
            swap(allocated);
            // We don't want to copy data that we know we'll overwrite
        }

        auto offset = freeSpaceAtBegin();
        const auto capacityBegin = begin() - offset;
        const auto prependBufferEnd = begin();

        if constexpr (!std::is_nothrow_constructible_v<T, decltype(std::invoke(proj, *first))>) {
            // If construction can throw, and we have freeSpaceAtBegin(),
            // it's easiest to just clear the container and start fresh.
            // The alternative would be to keep track of two active, disjoint ranges.
            if (offset) {
                (*this)->truncate(0);
                setBegin(capacityBegin);
                offset = 0;
            }
        }

        auto dst = capacityBegin;
        const auto dend = end();
        if (offset) { // avoids dead stores
            setBegin(capacityBegin); // undo prepend optimization

            // By construction, the following loop is nothrow!
            // (otherwise, we can't reach here)
            // Assumes InputIterator operations don't throw.
            // (but we can't statically assert that, as these operations
            //  have preconditons, so typically aren't noexcept)
            while (true) {
                if (dst == prependBufferEnd) {  // ran out of prepend buffer space
                    size += offset;
                    // we now have a contiguous buffer, continue with the main loop:
                    break;
                }
                if (first == last) {            // ran out of elements to assign
                    std::destroy(prependBufferEnd, dend);
                    size = dst - begin();
                    return;
                }
                // construct element in prepend buffer
                q20::construct_at(dst, std::invoke(proj, *first));
                ++dst;
                ++first;
            }
        }

        while (true) {
            if (first == last) {    // ran out of elements to assign
                std::destroy(dst, dend);
                break;
            }
            if (dst == dend) {      // ran out of existing elements to overwrite
                if constexpr (IsFwdIt && IsIdentity) {
                    dst = std::uninitialized_copy(first, last, dst);
                    break;
                } else if constexpr (IsFwdIt && !IsIdentity
                           && std::is_nothrow_constructible_v<T, decltype(std::invoke(proj, *first))>) {
                    for (; first != last; ++dst, ++first)   // uninitialized_copy with projection
                        q20::construct_at(dst, std::invoke(proj, *first));
                    break;
                } else {
                    do {
                        (*this)->emplace(size, std::invoke(proj, *first));
                    } while (++first != last);
                    return;         // size() is already correct (and dst invalidated)!
                }
            }
            *dst = std::invoke(proj, *first);    // overwrite existing element
            ++dst;
            ++first;
        }
        size = dst - begin();
    }